

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_policy.cpp
# Opt level: O0

ValuedAction __thiscall despot::RandomPolicy::Search(RandomPolicy *this)

{
  int iVar1;
  size_type sVar2;
  double rand_num;
  ValuedAction VVar3;
  double dummy_value;
  RandomPolicy *this_local;
  double local_10;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->action_probs_);
  if (sVar2 == 0) {
    iVar1 = (*((this->super_DefaultPolicy).super_ScenarioLowerBound.model_)->_vptr_DSPOMDP[5])();
    iVar1 = Random::NextInt((Random *)&Random::RANDOM,iVar1);
    ValuedAction::ValuedAction((ValuedAction *)&this_local,iVar1,-INFINITY);
  }
  else {
    rand_num = Random::NextDouble((Random *)&Random::RANDOM);
    iVar1 = Random::GetCategory(&this->action_probs_,rand_num);
    ValuedAction::ValuedAction((ValuedAction *)&this_local,iVar1,-INFINITY);
  }
  VVar3._4_4_ = 0;
  VVar3.action = (uint)this_local;
  VVar3.value = local_10;
  return VVar3;
}

Assistant:

ValuedAction RandomPolicy::Search() {
	double dummy_value = Globals::NEG_INFTY;
	if (action_probs_.size() > 0) {
		return ValuedAction(
			Random::GetCategory(action_probs_, Random::RANDOM.NextDouble()),
			dummy_value);
	} else {
		return ValuedAction(Random::RANDOM.NextInt(model_->NumActions()),
			dummy_value);
	}
}